

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenFltNum(Lexer *this,size_t num)

{
  bool bVar1;
  int iVar2;
  ulong in_RDX;
  undefined1 auVar3 [16];
  float local_124;
  Position local_120;
  undefined1 local_102 [18];
  Position local_f0;
  Position local_d8;
  undefined1 local_c0 [46];
  undefined1 local_92 [10];
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> local_88;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> tok;
  double po64;
  undefined1 auStack_70 [4];
  float po32;
  Position local_58;
  Position local_40;
  double f64;
  ulong uStack_20;
  float f32;
  size_t num_local;
  Lexer *this_local;
  
  uStack_20 = in_RDX;
  num_local = num;
  this_local = this;
  nextChar((Lexer *)num);
  local_124 = (float)uStack_20;
  f64._4_4_ = local_124;
  auVar3._8_4_ = (int)(uStack_20 >> 0x20);
  auVar3._0_8_ = uStack_20;
  auVar3._12_4_ = 0x45300000;
  local_40.endIndex =
       (size_t)((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uStack_20) - 4503599627370496.0));
  iVar2 = isdigit(*(int *)(num + 0xb0));
  if (iVar2 == 0) {
    local_40.line._6_2_ = 2;
    local_40.line._0_4_ = 9;
    getCurrentCursor((Position *)auStack_70,(Lexer *)num);
    Position::Position(&local_58,_auStack_70,*(size_t *)(num + 0xa8),*(size_t *)(num + 0xa8));
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)&local_40.startIndex,(LexerErrorCode *)((long)&local_40.line + 6),&local_40)
    ;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)&local_40.startIndex);
  }
  else {
    po64._4_4_ = 10.0;
    tok._M_t.super___uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_>.
    super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl =
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>)0x4024000000000000;
    do {
      f64._4_4_ = (float)(*(int *)(num + 0xb0) + -0x30) / po64._4_4_ + f64._4_4_;
      local_40.endIndex =
           (size_t)((double)(*(int *)(num + 0xb0) + -0x30) /
                    (double)tok._M_t.
                            super___uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_>
                            .super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl +
                   (double)local_40.endIndex);
      po64._4_4_ = po64._4_4_ * 10.0;
      tok._M_t.super___uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_>.
      super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           ((double)tok._M_t.
                    super___uniq_ptr_impl<pfederc::Token,_std::default_delete<pfederc::Token>_>._M_t
                    .super__Tuple_impl<0UL,_pfederc::Token_*,_std::default_delete<pfederc::Token>_>.
                    super__Head_base<0UL,_pfederc::Token_*,_false>._M_head_impl * 10.0);
      iVar2 = nextChar((Lexer *)num);
      iVar2 = isdigit(iVar2);
    } while (iVar2 != 0);
    std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
    unique_ptr<std::default_delete<pfederc::Token>,void>
              ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_88,
               (nullptr_t)0x0);
    if (*(int *)(num + 0xb0) == 0x46) {
      nextChar((Lexer *)num);
    }
    else if (*(int *)(num + 0xb0) == 0x66) {
      nextChar((Lexer *)num);
      local_92._0_2_ = 0xe;
      getCurrentCursor((Position *)(local_c0 + 0x10),(Lexer *)num);
      std::
      make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,float&>
                ((Token **)(local_92 + 2),(TokenType *)(num + 0xb8),(Position *)local_92,
                 (float *)(local_c0 + 0x10));
      std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::operator=
                ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)&local_88,
                 (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_92 + 2));
      std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::~unique_ptr
                ((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                 (local_92 + 2));
    }
    iVar2 = isalnum(*(int *)(num + 0xb0));
    if (iVar2 == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_88);
      if (bVar1) {
        std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::unique_ptr
                  ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)this,
                   &local_88);
      }
      else {
        local_102._0_2_ = 0xf;
        getCurrentCursor(&local_120,(Lexer *)num);
        std::
        make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,double&>
                  ((Token **)(local_102 + 2),(TokenType *)(num + 0xb8),(Position *)local_102,
                   (double *)&local_120);
        std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>::
        unique_ptr<pfederc::NumberToken,std::default_delete<pfederc::NumberToken>,void>
                  ((unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>> *)this,
                   (unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                   (local_102 + 2));
        std::unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_>::
        ~unique_ptr((unique_ptr<pfederc::NumberToken,_std::default_delete<pfederc::NumberToken>_> *)
                    (local_102 + 2));
      }
    }
    else {
      local_c0._6_2_ = 2;
      local_c0._0_4_ = 9;
      getCurrentCursor(&local_f0,(Lexer *)num);
      Position::Position(&local_d8,local_f0.line,*(size_t *)(num + 0xa8),*(size_t *)(num + 0xa8));
      std::
      make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                ((Level *)(local_c0 + 8),(LexerErrorCode *)(local_c0 + 6),(Position *)local_c0);
      generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                          *)num);
      std::
      unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                     *)(local_c0 + 8));
    }
    local_102._14_4_ = 1;
    std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::~unique_ptr(&local_88);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenFltNum(size_t num) noexcept {
  nextChar(); // eat .

  float f32 = static_cast<float>(num);
  double f64 = static_cast<double>(num);
  
  if (!isdigit(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  float po32 = 10.0f;
  double po64 = 10.0;

  do {
    f32 += static_cast<float>(currentChar - '0') / po32;
    f64 += static_cast<double>(currentChar - '0') / po64;
    po32 *= 10.0f;
    po64 *= 10.0;
  } while (isdigit(nextChar()));

  std::unique_ptr<Token> tok(nullptr);
  switch (currentChar) {
  case 'f':
    nextChar(); // eat f
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_FLT32, getCurrentCursor(), f32);
    break;
  case 'F':
    nextChar(); // eat F
    break;
  default:
    break;
  }

  if (isalnum(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  if (tok)
    return tok;

  return std::make_unique<NumberToken>(currentToken, TokenType::TOK_FLT64, getCurrentCursor(), f64);
}